

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

__visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
 __thiscall
matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>::hasValue
          (IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *this)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
  _Var1;
  anon_class_1_0_00000001 local_14;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1179:45)>
  local_11;
  IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *local_10;
  IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *this_local;
  
  local_10 = this;
  overload<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::shared_ptr<mathiu::impl::Expr_const>const&)_1_,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::shared_ptr<mathiu::impl::Expr_const>const*)_1_,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::monostate_const&)_1_>
            (&local_12,&local_13,&local_14);
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::shared_ptr<mathiu::impl::Expr_const>const&)_1_,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::shared_ptr<mathiu::impl::Expr_const>const*)_1_,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>*,std::shared_ptr<mathiu::impl::Expr_const>const*>const&>
                    (&local_11,
                     &(this->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).mVariant
                    );
  return _Var1;
}

Assistant:

constexpr auto hasValue() const
            {
                return std::visit(overload([](Type const &)
                                            { return true; },
                                            [](Type const *)
                                            { return true; },
                                            // [](Type *)
                                            // { return true; },
                                            [](std::monostate const &)
                                            { return false; }),
                                    IdBlockBase<Type>::mVariant);
            }